

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O1

TransactionContext * __thiscall
cfd::TransactionContext::operator=(TransactionContext *this,TransactionContext *context)

{
  string local_38;
  
  if (this != context) {
    core::AbstractTransaction::GetHex_abi_cxx11_(&local_38,(AbstractTransaction *)context);
    core::Transaction::SetFromHex(&this->super_Transaction,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator=
              (&this->utxo_map_,&context->utxo_map_);
    std::
    _Rb_tree<cfd::core::OutPoint,_std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>,_std::_Select1st<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
    ::operator=(&(this->signed_map_)._M_t,&(context->signed_map_)._M_t);
    std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::operator=
              (&this->verify_map_,&context->verify_map_);
    std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::operator=
              (&this->verify_ignore_map_,&context->verify_ignore_map_);
  }
  return this;
}

Assistant:

TransactionContext& TransactionContext::operator=(
    const TransactionContext& context) & {
  if (this != &context) {
    SetFromHex(context.GetHex());
    utxo_map_ = context.utxo_map_;
    signed_map_ = context.signed_map_;
    verify_map_ = context.verify_map_;
    verify_ignore_map_ = context.verify_ignore_map_;
  }
  return *this;
}